

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv)

{
  REF_CELL pRVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong in_RAX;
  REF_GRID pRVar5;
  REF_CELL *ppRVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  REF_INT nmark;
  REF_BOOL again;
  
  _nmark = in_RAX;
  uVar2 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar2 == 0) {
    _nmark = CONCAT44(1,nmark);
    uVar2 = 0;
    iVar8 = 1;
    while (iVar8 != 0) {
      _nmark = _nmark & 0xffffffff;
      pRVar5 = ref_subdiv->grid;
      ppRVar6 = pRVar5->cell + 8;
      for (lVar11 = 8; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        pRVar1 = *ppRVar6;
        for (iVar8 = 0; iVar8 < pRVar1->max; iVar8 = iVar8 + 1) {
          if ((pRVar1->c2n[(long)iVar8 * (long)pRVar1->size_per] != -1) && (pRVar1->node_per == 4))
          {
            ref_subdiv_unmark_tet(ref_subdiv,iVar8,&again);
          }
        }
        pRVar5 = ref_subdiv->grid;
        ppRVar6 = pRVar5->cell + lVar11 + 1;
      }
      uVar3 = ref_edge_ghost_min_int(ref_subdiv->edge,pRVar5->mpi,ref_subdiv->mark);
      if (uVar3 != 0) {
        uVar9 = (ulong)uVar3;
        pcVar10 = "ghost mark";
        uVar7 = 0x248;
        goto LAB_001d8b17;
      }
      uVar3 = uVar2 + 1;
      if (4 < uVar2) {
        uVar2 = ref_subdiv_mark_n(ref_subdiv,&nmark);
        if (uVar2 != 0) {
          uVar9 = (ulong)uVar2;
          pcVar10 = "count";
          uVar7 = 0x24b;
          goto LAB_001d8b17;
        }
        if (ref_subdiv->grid->mpi->id == 0) {
          printf(" %d edges marked after %d unmark relaxations\n",_nmark & 0xffffffff,(ulong)uVar3);
        }
        if (uVar3 == 200) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x251,"ref_subdiv_unmark_relax","too many sweeps, stop inf loop");
          return 1;
        }
      }
      uVar2 = ref_mpi_all_or(ref_subdiv->grid->mpi,&again);
      if (uVar2 != 0) {
        uVar9 = (ulong)uVar2;
        pcVar10 = "mpi all or";
        uVar7 = 0x253;
        goto LAB_001d8b17;
      }
      uVar2 = uVar3;
      iVar8 = again;
    }
    uVar3 = 0;
    if (ref_subdiv->instrument != 0) {
      uVar4 = ref_subdiv_mark_n(ref_subdiv,&nmark);
      if (uVar4 == 0) {
        if (ref_subdiv->grid->mpi->id == 0) {
          uVar3 = 0;
          printf(" %d edges marked after %d unmark relaxations\n",_nmark & 0xffffffff,(ulong)uVar2);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               599,"ref_subdiv_unmark_relax",(ulong)uVar4,"count");
        uVar3 = uVar4;
      }
    }
  }
  else {
    uVar9 = (ulong)uVar2;
    pcVar10 = "ghost mark";
    uVar7 = 0x22e;
LAB_001d8b17:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar7,
           "ref_subdiv_unmark_relax",uVar9,pcVar10);
    uVar3 = (uint)uVar9;
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, nsweeps, nmark;
  REF_CELL ref_cell;
  REF_BOOL again;

  /* make sure consistent before starting */
  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:

            RSS(ref_subdiv_unmark_tet(ref_subdiv, cell, &again), "unmark tet");

            break;
          default:
            /* RSS(REF_IMPLEMENT,"implement cell type"); */
            break;
        }
      }
    }

    /* most conservative, unmark if any ghosts unmarked */
    RSS(ref_edge_ghost_min_int(ref_subdiv_edge(ref_subdiv),
                               ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    if (nsweeps > 5) {
      RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
      if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
        printf(" %d edges marked after %d unmark relaxations\n", nmark,
               nsweeps);
    }

    RUS(200, nsweeps, "too many sweeps, stop inf loop");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d unmark relaxations\n", nmark, nsweeps);
  }

  return REF_SUCCESS;
}